

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  char cVar1;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar2;
  ImGuiTableColumn *pIVar3;
  undefined1 auVar4 [16];
  ImGuiTableColumn *pIVar5;
  ImGuiTableColumn *pIVar6;
  float fVar7;
  undefined1 auVar8 [64];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 extraout_var [60];
  
  table = GImGui->CurrentTable;
  if ((table == (ImGuiTable *)0x0) || (table->IsLayoutLocked != false)) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7cb,"void ImGui::TableSetColumnWidth(int, float)");
  }
  if ((column_n < 0) || (table->ColumnsCount <= column_n)) {
    __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7cc,"void ImGui::TableSetColumnWidth(int, float)");
  }
  pIVar6 = (table->Columns).Data + (uint)column_n;
  if ((table->Columns).DataEnd <= pIVar6) goto LAB_001966b3;
  auVar10 = ZEXT416((uint)table->MinColumnWidth);
  if (table->MinColumnWidth <= 0.0) {
    __assert_fail("table->MinColumnWidth > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x7d2,"void ImGui::TableSetColumnWidth(int, float)");
  }
  auVar8._0_4_ = TableGetMaxColumnWidth(table,column_n);
  auVar8._4_60_ = extraout_var;
  auVar4 = vcmpss_avx(auVar8._0_16_,auVar10,2);
  auVar4 = vblendvps_avx(auVar8._0_16_,auVar10,auVar4);
  auVar11 = vminss_avx(auVar4,ZEXT416((uint)width));
  auVar4 = vcmpss_avx(ZEXT416((uint)width),auVar10,1);
  auVar4 = vblendvps_avx(auVar11,auVar10,auVar4);
  fVar9 = auVar4._0_4_;
  if ((pIVar6->WidthGiven == fVar9) && (!NAN(pIVar6->WidthGiven) && !NAN(fVar9))) {
    return;
  }
  fVar7 = pIVar6->WidthRequest;
  if ((fVar7 == fVar9) && (!NAN(fVar7) && !NAN(fVar9))) {
    return;
  }
  cVar1 = pIVar6->NextEnabledColumn;
  if ((long)cVar1 == -1) {
    if ((pIVar6->Flags & 8) != 0) {
LAB_00196660:
      pIVar6->WidthRequest = fVar9;
      goto LAB_00196666;
    }
LAB_001965a2:
    if (pIVar6->PrevEnabledColumn == -1) {
      return;
    }
    pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)pIVar6->PrevEnabledColumn);
    fVar7 = pIVar6->WidthRequest;
  }
  else {
    if (cVar1 < '\0') {
LAB_001966b3:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                    ,0x216,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pIVar2 = (table->Columns).Data;
    pIVar3 = (table->Columns).DataEnd;
    pIVar5 = pIVar2 + cVar1;
    if (pIVar3 <= pIVar5) goto LAB_001966b3;
    if ((pIVar6->Flags & 8) != 0) {
      if (pIVar2 != (ImGuiTableColumn *)0x0) {
        cVar1 = table->LeftMostStretchedColumn;
        if ((long)cVar1 != -1) {
          if ((cVar1 < '\0') || (pIVar3 <= pIVar2 + cVar1)) goto LAB_001966b3;
          if (pIVar2[cVar1].DisplayOrder < pIVar6->DisplayOrder) goto LAB_0019660a;
        }
      }
      goto LAB_00196660;
    }
    if (pIVar2 == (ImGuiTableColumn *)0x0) goto LAB_001965a2;
  }
LAB_0019660a:
  auVar11 = ZEXT416((uint)(pIVar5->WidthRequest - (fVar9 - fVar7)));
  auVar4 = vcmpss_avx(auVar10,auVar11,2);
  auVar10 = vblendvps_avx(auVar10,auVar11,auVar4);
  fVar9 = auVar10._0_4_;
  if ((fVar9 <= 0.0) || (fVar7 = (pIVar5->WidthRequest + fVar7) - fVar9, fVar7 <= 0.0)) {
    __assert_fail("column_0_width > 0.0f && column_1_width > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x810,"void ImGui::TableSetColumnWidth(int, float)");
  }
  pIVar6->WidthRequest = fVar7;
  pIVar5->WidthRequest = fVar9;
  if (((pIVar5->Flags | pIVar6->Flags) & 4U) != 0) {
    TableUpdateColumnsWeightFromWidth(table);
  }
LAB_00196666:
  table->IsSettingsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Apply constraints early
    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    IM_ASSERT(table->MinColumnWidth > 0.0f);
    const float min_width = table->MinColumnWidth;
    const float max_width = ImMax(min_width, TableGetMaxColumnWidth(table, column_n));
    column_0_width = ImClamp(column_0_width, min_width, max_width);
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthGiven, column_0_width);
    ImGuiTableColumn* column_1 = (column_0->NextEnabledColumn != -1) ? &table->Columns[column_0->NextEnabledColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and multiple Stretch columns.
    // - All fixed: easy.
    // - All stretch: easy.
    // - One or more fixed + one stretch: easy.
    // - One or more fixed + more than one stretch: tricky.
    // Qt when manual resize is enabled only support a single _trailing_ stretch column.

    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> ok
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> ok
    // - F1 W2 F3  resize from W2|          --> ok
    // - F1 W3 F2  resize from W3|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move.
    // - W1 F2 F3  resize from F2|          --> ok
    // All resizes from a Wx columns are locking other columns.

    // Possible improvements:
    // - W1 W2 W3  resize W1|               --> to not be stuck, both W2 and W3 would stretch down. Seems possible to fix. Would be most beneficial to simplify resize of all-weighted columns.
    // - W3 F1 F2  resize W3|               --> to not be stuck past F1|, both F1 and F2 would need to stretch down, which would be lossy or ambiguous. Seems hard to fix.

    // [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().

    // If we have all Fixed columns OR resizing a Fixed column that doesn't come after a Stretch one, we can do an offsetting resize.
    // This is the preferred resize path
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
        if (!column_1 || table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder >= column_0->DisplayOrder)
        {
            column_0->WidthRequest = column_0_width;
            table->IsSettingsDirty = true;
            return;
        }

    // We can also use previous column if there's no next one (this is used when doing an auto-fit on the right-most stretch column)
    if (column_1 == NULL)
        column_1 = (column_0->PrevEnabledColumn != -1) ? &table->Columns[column_0->PrevEnabledColumn] : NULL;
    if (column_1 == NULL)
        return;

    // Resizing from right-side of a Stretch column before a Fixed column forward sizing to left-side of fixed column.
    // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
    float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
    column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
    IM_ASSERT(column_0_width > 0.0f && column_1_width > 0.0f);
    column_0->WidthRequest = column_0_width;
    column_1->WidthRequest = column_1_width;
    if ((column_0->Flags | column_1->Flags) & ImGuiTableColumnFlags_WidthStretch)
        TableUpdateColumnsWeightFromWidth(table);
    table->IsSettingsDirty = true;
}